

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O3

string * soul::simplifyWhitespace(string *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string_view firstReplacement;
  string_view firstReplacement_00;
  size_type sVar4;
  string_view firstToReplace;
  string_view firstToReplace_00;
  _Alloc_hider in_stack_ffffffffffffff48;
  _Alloc_hider _Var5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string *local_98;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar2,pcVar2 + s->_M_string_length)
  ;
  choc::text::trim(&local_50,&local_70);
  firstReplacement._M_str = " ";
  firstReplacement._M_len = (size_t)"\r";
  firstToReplace._M_str = (char *)0x1;
  firstToReplace._M_len = (size_t)"\t";
  choc::text::
  replace<std::__cxx11::string,char_const(&)[2],char_const(&)[2],char_const(&)[2],char_const(&)[2]>
            ((string *)&stack0xffffffffffffff48,(text *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1,firstToReplace
             ,firstReplacement,(char (*) [2])0x27f65b,(char (*) [2])0x2585e1,(char (*) [2])0x27f65b,
             (char (*) [2])in_stack_ffffffffffffff48._M_p);
  std::__cxx11::string::operator=((string *)s,(string *)&stack0xffffffffffffff48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffff48._M_p != &local_a8) {
    operator_delete(in_stack_ffffffffffffff48._M_p,local_a8._M_allocated_capacity + 1);
  }
  local_98 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = (s->_M_dataplus)._M_p;
  _Var5._M_p = (pointer)s->_M_string_length;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff48,
                     "  ",0,2);
  if (sVar4 != 0xffffffffffffffff) {
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar2,pcVar2 + s->_M_string_length);
      firstReplacement_00._M_str = pcVar6;
      firstReplacement_00._M_len = (size_t)_Var5._M_p;
      firstToReplace_00._M_str = (char *)0x1;
      firstToReplace_00._M_len = (size_t)"  ";
      choc::text::replace<std::__cxx11::string>
                ((string *)&stack0xffffffffffffff48,(text *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2,
                 firstToReplace_00,firstReplacement_00);
      std::__cxx11::string::operator=((string *)s,(string *)&stack0xffffffffffffff48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p != &local_a8) {
        operator_delete(_Var5._M_p,local_a8._M_allocated_capacity + 1);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      pcVar6 = (s->_M_dataplus)._M_p;
      _Var5._M_p = (pointer)s->_M_string_length;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffff48,"  ",0,2);
    } while (sVar4 != 0xffffffffffffffff);
  }
  (local_98->_M_dataplus)._M_p = (pointer)&local_98->field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&s->field_2 + 8);
    (local_98->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_98->field_2 + 8) = uVar3;
  }
  else {
    (local_98->_M_dataplus)._M_p = pcVar2;
    (local_98->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return local_98;
}

Assistant:

std::string simplifyWhitespace (std::string s)
{
    s = choc::text::replace (choc::text::trim (s), "\t", " ", "\r", " ", "\n", " ");

    while (choc::text::contains (s, "  "))
        s = choc::text::replace (s, "  ", " ");

    return s;
}